

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O3

void Eigen::internal::
     general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_0,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<float,_long,_0> *alhs,
          const_blas_data_mapper<float,_long,_0> *rhs,ResScalar *res,long resIncr,float alpha)

{
  ResScalar *pRVar1;
  float fVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float *pfVar18;
  long lVar19;
  long j_2;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  float *pfVar26;
  long j_1;
  float *pfVar27;
  float *pfVar28;
  long j;
  long lVar29;
  float *pfVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float *local_70;
  
  lVar3 = (alhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_stride;
  lVar24 = 4;
  if ((ulong)(lVar3 * 4) < 32000) {
    lVar24 = 0x10;
  }
  if (cols < 0x80) {
    lVar24 = cols;
  }
  if (0 < cols) {
    pfVar18 = (alhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
    pfVar30 = pfVar18 + 0x1c;
    lVar21 = lVar24 * lVar3;
    local_70 = pfVar18 + 8;
    lVar19 = 0;
    do {
      lVar22 = lVar24 + lVar19;
      lVar20 = cols;
      if (lVar22 < cols) {
        lVar20 = lVar22;
      }
      if (rows < 0x20) {
        uVar23 = 0;
      }
      else {
        uVar23 = 0;
        pfVar26 = pfVar30;
        do {
          fVar59 = 0.0;
          fVar60 = 0.0;
          fVar61 = 0.0;
          fVar62 = 0.0;
          fVar55 = 0.0;
          fVar56 = 0.0;
          fVar57 = 0.0;
          fVar58 = 0.0;
          fVar51 = 0.0;
          fVar52 = 0.0;
          fVar53 = 0.0;
          fVar54 = 0.0;
          fVar47 = 0.0;
          fVar48 = 0.0;
          fVar49 = 0.0;
          fVar50 = 0.0;
          fVar43 = 0.0;
          fVar44 = 0.0;
          fVar45 = 0.0;
          fVar46 = 0.0;
          fVar39 = 0.0;
          fVar40 = 0.0;
          fVar41 = 0.0;
          fVar42 = 0.0;
          fVar35 = 0.0;
          fVar36 = 0.0;
          fVar37 = 0.0;
          fVar38 = 0.0;
          fVar31 = 0.0;
          fVar32 = 0.0;
          fVar33 = 0.0;
          fVar34 = 0.0;
          pfVar27 = pfVar26;
          lVar29 = lVar19;
          do {
            fVar2 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar29];
            fVar59 = fVar59 + pfVar27[-0x1c] * fVar2;
            fVar60 = fVar60 + pfVar27[-0x1b] * fVar2;
            fVar61 = fVar61 + pfVar27[-0x1a] * fVar2;
            fVar62 = fVar62 + pfVar27[-0x19] * fVar2;
            fVar55 = fVar55 + pfVar27[-0x18] * fVar2;
            fVar56 = fVar56 + pfVar27[-0x17] * fVar2;
            fVar57 = fVar57 + pfVar27[-0x16] * fVar2;
            fVar58 = fVar58 + pfVar27[-0x15] * fVar2;
            fVar51 = fVar51 + pfVar27[-0x14] * fVar2;
            fVar52 = fVar52 + pfVar27[-0x13] * fVar2;
            fVar53 = fVar53 + pfVar27[-0x12] * fVar2;
            fVar54 = fVar54 + pfVar27[-0x11] * fVar2;
            fVar47 = fVar47 + pfVar27[-0x10] * fVar2;
            fVar48 = fVar48 + pfVar27[-0xf] * fVar2;
            fVar49 = fVar49 + pfVar27[-0xe] * fVar2;
            fVar50 = fVar50 + pfVar27[-0xd] * fVar2;
            fVar43 = fVar43 + pfVar27[-0xc] * fVar2;
            fVar44 = fVar44 + pfVar27[-0xb] * fVar2;
            fVar45 = fVar45 + pfVar27[-10] * fVar2;
            fVar46 = fVar46 + pfVar27[-9] * fVar2;
            fVar39 = fVar39 + pfVar27[-8] * fVar2;
            fVar40 = fVar40 + pfVar27[-7] * fVar2;
            fVar41 = fVar41 + pfVar27[-6] * fVar2;
            fVar42 = fVar42 + pfVar27[-5] * fVar2;
            fVar35 = fVar35 + pfVar27[-4] * fVar2;
            fVar36 = fVar36 + pfVar27[-3] * fVar2;
            fVar37 = fVar37 + pfVar27[-2] * fVar2;
            fVar38 = fVar38 + pfVar27[-1] * fVar2;
            fVar31 = fVar31 + *pfVar27 * fVar2;
            fVar32 = fVar32 + pfVar27[1] * fVar2;
            fVar33 = fVar33 + pfVar27[2] * fVar2;
            fVar34 = fVar34 + pfVar27[3] * fVar2;
            lVar29 = lVar29 + 1;
            pfVar27 = pfVar27 + lVar3;
          } while (lVar29 < lVar20);
          pfVar27 = res + uVar23;
          fVar2 = pfVar27[1];
          fVar4 = pfVar27[2];
          fVar5 = pfVar27[3];
          pfVar28 = res + uVar23 + 4;
          fVar6 = *pfVar28;
          fVar7 = pfVar28[1];
          fVar8 = pfVar28[2];
          fVar9 = pfVar28[3];
          pfVar28 = res + uVar23 + 8;
          fVar10 = *pfVar28;
          fVar11 = pfVar28[1];
          fVar12 = pfVar28[2];
          fVar13 = pfVar28[3];
          pfVar28 = res + uVar23 + 0xc;
          fVar14 = *pfVar28;
          fVar15 = pfVar28[1];
          fVar16 = pfVar28[2];
          fVar17 = pfVar28[3];
          pRVar1 = res + uVar23;
          *pRVar1 = *pfVar27 + fVar59 * alpha;
          pRVar1[1] = fVar2 + fVar60 * alpha;
          pRVar1[2] = fVar4 + fVar61 * alpha;
          pRVar1[3] = fVar5 + fVar62 * alpha;
          pRVar1 = res + uVar23 + 4;
          *pRVar1 = fVar55 * alpha + fVar6;
          pRVar1[1] = fVar56 * alpha + fVar7;
          pRVar1[2] = fVar57 * alpha + fVar8;
          pRVar1[3] = fVar58 * alpha + fVar9;
          pRVar1 = res + uVar23 + 8;
          *pRVar1 = fVar51 * alpha + fVar10;
          pRVar1[1] = fVar52 * alpha + fVar11;
          pRVar1[2] = fVar53 * alpha + fVar12;
          pRVar1[3] = fVar54 * alpha + fVar13;
          pRVar1 = res + uVar23 + 0xc;
          *pRVar1 = fVar47 * alpha + fVar14;
          pRVar1[1] = fVar48 * alpha + fVar15;
          pRVar1[2] = fVar49 * alpha + fVar16;
          pRVar1[3] = fVar50 * alpha + fVar17;
          pfVar27 = res + uVar23 + 0x10;
          fVar47 = pfVar27[1];
          fVar48 = pfVar27[2];
          fVar49 = pfVar27[3];
          pRVar1 = res + uVar23 + 0x10;
          *pRVar1 = fVar43 * alpha + *pfVar27;
          pRVar1[1] = fVar44 * alpha + fVar47;
          pRVar1[2] = fVar45 * alpha + fVar48;
          pRVar1[3] = fVar46 * alpha + fVar49;
          pfVar27 = res + uVar23 + 0x14;
          fVar43 = pfVar27[1];
          fVar44 = pfVar27[2];
          fVar45 = pfVar27[3];
          pRVar1 = res + uVar23 + 0x14;
          *pRVar1 = fVar39 * alpha + *pfVar27;
          pRVar1[1] = fVar40 * alpha + fVar43;
          pRVar1[2] = fVar41 * alpha + fVar44;
          pRVar1[3] = fVar42 * alpha + fVar45;
          pfVar27 = res + uVar23 + 0x18;
          fVar39 = pfVar27[1];
          fVar40 = pfVar27[2];
          fVar41 = pfVar27[3];
          pRVar1 = res + uVar23 + 0x18;
          *pRVar1 = fVar35 * alpha + *pfVar27;
          pRVar1[1] = fVar36 * alpha + fVar39;
          pRVar1[2] = fVar37 * alpha + fVar40;
          pRVar1[3] = fVar38 * alpha + fVar41;
          pfVar27 = res + uVar23 + 0x1c;
          fVar35 = pfVar27[1];
          fVar36 = pfVar27[2];
          fVar37 = pfVar27[3];
          pRVar1 = res + uVar23 + 0x1c;
          *pRVar1 = fVar31 * alpha + *pfVar27;
          pRVar1[1] = fVar32 * alpha + fVar35;
          pRVar1[2] = fVar33 * alpha + fVar36;
          pRVar1[3] = fVar34 * alpha + fVar37;
          uVar23 = uVar23 + 0x20;
          pfVar26 = pfVar26 + 0x20;
        } while ((long)uVar23 < rows + -0x1f);
      }
      if ((long)uVar23 < rows + -0xf) {
        pfVar26 = pfVar18 + uVar23;
        fVar43 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar42 = 0.0;
        fVar35 = 0.0;
        fVar36 = 0.0;
        fVar37 = 0.0;
        fVar38 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        lVar29 = lVar19;
        do {
          fVar47 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar29];
          fVar43 = fVar43 + *pfVar26 * fVar47;
          fVar44 = fVar44 + pfVar26[1] * fVar47;
          fVar45 = fVar45 + pfVar26[2] * fVar47;
          fVar46 = fVar46 + pfVar26[3] * fVar47;
          fVar39 = fVar39 + pfVar26[4] * fVar47;
          fVar40 = fVar40 + pfVar26[5] * fVar47;
          fVar41 = fVar41 + pfVar26[6] * fVar47;
          fVar42 = fVar42 + pfVar26[7] * fVar47;
          fVar35 = fVar35 + pfVar26[8] * fVar47;
          fVar36 = fVar36 + pfVar26[9] * fVar47;
          fVar37 = fVar37 + pfVar26[10] * fVar47;
          fVar38 = fVar38 + pfVar26[0xb] * fVar47;
          fVar31 = fVar31 + pfVar26[0xc] * fVar47;
          fVar32 = fVar32 + pfVar26[0xd] * fVar47;
          fVar33 = fVar33 + pfVar26[0xe] * fVar47;
          fVar34 = fVar34 + pfVar26[0xf] * fVar47;
          lVar29 = lVar29 + 1;
          pfVar26 = pfVar26 + lVar3;
        } while (lVar29 < lVar20);
        pfVar26 = res + uVar23;
        fVar47 = pfVar26[1];
        fVar48 = pfVar26[2];
        fVar49 = pfVar26[3];
        pfVar27 = res + uVar23 + 4;
        fVar50 = *pfVar27;
        fVar51 = pfVar27[1];
        fVar52 = pfVar27[2];
        fVar53 = pfVar27[3];
        pfVar27 = res + uVar23 + 8;
        fVar54 = *pfVar27;
        fVar55 = pfVar27[1];
        fVar56 = pfVar27[2];
        fVar57 = pfVar27[3];
        pfVar27 = res + uVar23 + 0xc;
        fVar58 = *pfVar27;
        fVar59 = pfVar27[1];
        fVar60 = pfVar27[2];
        fVar61 = pfVar27[3];
        pRVar1 = res + uVar23;
        *pRVar1 = *pfVar26 + fVar43 * alpha;
        pRVar1[1] = fVar47 + fVar44 * alpha;
        pRVar1[2] = fVar48 + fVar45 * alpha;
        pRVar1[3] = fVar49 + fVar46 * alpha;
        pRVar1 = res + uVar23 + 4;
        *pRVar1 = fVar39 * alpha + fVar50;
        pRVar1[1] = fVar40 * alpha + fVar51;
        pRVar1[2] = fVar41 * alpha + fVar52;
        pRVar1[3] = fVar42 * alpha + fVar53;
        pRVar1 = res + uVar23 + 8;
        *pRVar1 = fVar35 * alpha + fVar54;
        pRVar1[1] = fVar36 * alpha + fVar55;
        pRVar1[2] = fVar37 * alpha + fVar56;
        pRVar1[3] = fVar38 * alpha + fVar57;
        pRVar1 = res + uVar23 + 0xc;
        *pRVar1 = fVar31 * alpha + fVar58;
        pRVar1[1] = fVar32 * alpha + fVar59;
        pRVar1[2] = fVar33 * alpha + fVar60;
        pRVar1[3] = fVar34 * alpha + fVar61;
        uVar23 = uVar23 | 0x10;
      }
      if ((long)uVar23 < rows + -0xb) {
        pfVar26 = local_70 + uVar23;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar42 = 0.0;
        fVar35 = 0.0;
        fVar36 = 0.0;
        fVar37 = 0.0;
        fVar38 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        lVar29 = lVar19;
        do {
          fVar43 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar29];
          fVar39 = fVar39 + pfVar26[-8] * fVar43;
          fVar40 = fVar40 + pfVar26[-7] * fVar43;
          fVar41 = fVar41 + pfVar26[-6] * fVar43;
          fVar42 = fVar42 + pfVar26[-5] * fVar43;
          fVar35 = fVar35 + pfVar26[-4] * fVar43;
          fVar36 = fVar36 + pfVar26[-3] * fVar43;
          fVar37 = fVar37 + pfVar26[-2] * fVar43;
          fVar38 = fVar38 + pfVar26[-1] * fVar43;
          fVar31 = fVar31 + *pfVar26 * fVar43;
          fVar32 = fVar32 + pfVar26[1] * fVar43;
          fVar33 = fVar33 + pfVar26[2] * fVar43;
          fVar34 = fVar34 + pfVar26[3] * fVar43;
          lVar29 = lVar29 + 1;
          pfVar26 = pfVar26 + lVar3;
        } while (lVar29 < lVar20);
        pfVar26 = res + uVar23;
        fVar43 = pfVar26[1];
        fVar44 = pfVar26[2];
        fVar45 = pfVar26[3];
        pfVar27 = res + uVar23 + 4;
        fVar46 = *pfVar27;
        fVar47 = pfVar27[1];
        fVar48 = pfVar27[2];
        fVar49 = pfVar27[3];
        pfVar27 = res + uVar23 + 8;
        fVar50 = *pfVar27;
        fVar51 = pfVar27[1];
        fVar52 = pfVar27[2];
        fVar53 = pfVar27[3];
        pRVar1 = res + uVar23;
        *pRVar1 = *pfVar26 + fVar39 * alpha;
        pRVar1[1] = fVar43 + fVar40 * alpha;
        pRVar1[2] = fVar44 + fVar41 * alpha;
        pRVar1[3] = fVar45 + fVar42 * alpha;
        pRVar1 = res + uVar23 + 4;
        *pRVar1 = fVar35 * alpha + fVar46;
        pRVar1[1] = fVar36 * alpha + fVar47;
        pRVar1[2] = fVar37 * alpha + fVar48;
        pRVar1[3] = fVar38 * alpha + fVar49;
        pRVar1 = res + uVar23 + 8;
        *pRVar1 = fVar31 * alpha + fVar50;
        pRVar1[1] = fVar32 * alpha + fVar51;
        pRVar1[2] = fVar33 * alpha + fVar52;
        pRVar1[3] = fVar34 * alpha + fVar53;
        uVar23 = uVar23 + 0xc;
      }
      if ((long)uVar23 < rows + -7) {
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar35 = 0.0;
        fVar36 = 0.0;
        fVar37 = 0.0;
        fVar38 = 0.0;
        uVar25 = uVar23;
        lVar29 = lVar19;
        do {
          fVar39 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar29];
          pfVar26 = pfVar18 + uVar25;
          pfVar27 = pfVar18 + uVar25 + 4;
          fVar35 = fVar35 + *pfVar26 * fVar39;
          fVar36 = fVar36 + pfVar26[1] * fVar39;
          fVar37 = fVar37 + pfVar26[2] * fVar39;
          fVar38 = fVar38 + pfVar26[3] * fVar39;
          fVar31 = fVar31 + *pfVar27 * fVar39;
          fVar32 = fVar32 + pfVar27[1] * fVar39;
          fVar33 = fVar33 + pfVar27[2] * fVar39;
          fVar34 = fVar34 + pfVar27[3] * fVar39;
          lVar29 = lVar29 + 1;
          uVar25 = uVar25 + lVar3;
        } while (lVar29 < lVar20);
        pfVar26 = res + uVar23;
        fVar39 = pfVar26[1];
        fVar40 = pfVar26[2];
        fVar41 = pfVar26[3];
        pfVar27 = res + uVar23 + 4;
        fVar42 = *pfVar27;
        fVar43 = pfVar27[1];
        fVar44 = pfVar27[2];
        fVar45 = pfVar27[3];
        pRVar1 = res + uVar23;
        *pRVar1 = *pfVar26 + fVar35 * alpha;
        pRVar1[1] = fVar39 + fVar36 * alpha;
        pRVar1[2] = fVar40 + fVar37 * alpha;
        pRVar1[3] = fVar41 + fVar38 * alpha;
        pRVar1 = res + uVar23 + 4;
        *pRVar1 = fVar31 * alpha + fVar42;
        pRVar1[1] = fVar32 * alpha + fVar43;
        pRVar1[2] = fVar33 * alpha + fVar44;
        pRVar1[3] = fVar34 * alpha + fVar45;
        uVar23 = uVar23 + 8;
      }
      if ((long)uVar23 < rows + -3) {
        pfVar26 = pfVar18 + uVar23;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        lVar29 = lVar19;
        do {
          fVar35 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar29];
          fVar31 = fVar31 + *pfVar26 * fVar35;
          fVar32 = fVar32 + pfVar26[1] * fVar35;
          fVar33 = fVar33 + pfVar26[2] * fVar35;
          fVar34 = fVar34 + pfVar26[3] * fVar35;
          lVar29 = lVar29 + 1;
          pfVar26 = pfVar26 + lVar3;
        } while (lVar29 < lVar20);
        pfVar26 = res + uVar23;
        fVar35 = pfVar26[1];
        fVar36 = pfVar26[2];
        fVar37 = pfVar26[3];
        pRVar1 = res + uVar23;
        *pRVar1 = fVar31 * alpha + *pfVar26;
        pRVar1[1] = fVar32 * alpha + fVar35;
        pRVar1[2] = fVar33 * alpha + fVar36;
        pRVar1[3] = fVar34 * alpha + fVar37;
        uVar23 = uVar23 + 4;
      }
      if ((long)uVar23 < rows) {
        pfVar27 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
        pfVar26 = pfVar18 + uVar23;
        do {
          fVar31 = 0.0;
          lVar29 = lVar19;
          pfVar28 = pfVar26;
          do {
            fVar31 = fVar31 + *pfVar28 * pfVar27[lVar29];
            lVar29 = lVar29 + 1;
            pfVar28 = pfVar28 + lVar3;
          } while (lVar29 < lVar20);
          res[uVar23] = fVar31 * alpha + res[uVar23];
          uVar23 = uVar23 + 1;
          pfVar26 = pfVar26 + 1;
        } while (uVar23 != rows);
      }
      pfVar30 = pfVar30 + lVar21;
      pfVar18 = pfVar18 + lVar21;
      local_70 = local_70 + lVar21;
      lVar19 = lVar22;
    } while (lVar22 < cols);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,ColMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
        ResScalar* res, Index resIncr,
  RhsScalar alpha)
{
  EIGEN_UNUSED_VARIABLE(resIncr);
  eigen_internal_assert(resIncr==1);

  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  conj_helper<LhsPacketHalf,RhsPacketHalf,ConjugateLhs,ConjugateRhs> pcj_half;
  conj_helper<LhsPacketQuarter,RhsPacketQuarter,ConjugateLhs,ConjugateRhs> pcj_quarter;

  const Index lhsStride = lhs.stride();
  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned,
         ResPacketSize = Traits::ResPacketSize,
         ResPacketSizeHalf = HalfTraits::ResPacketSize,
         ResPacketSizeQuarter = QuarterTraits::ResPacketSize,
         LhsPacketSize = Traits::LhsPacketSize,
         HasHalf = (int)ResPacketSizeHalf < (int)ResPacketSize,
         HasQuarter = (int)ResPacketSizeQuarter < (int)ResPacketSizeHalf
  };

  const Index n8 = rows-8*ResPacketSize+1;
  const Index n4 = rows-4*ResPacketSize+1;
  const Index n3 = rows-3*ResPacketSize+1;
  const Index n2 = rows-2*ResPacketSize+1;
  const Index n1 = rows-1*ResPacketSize+1;
  const Index n_half = rows-1*ResPacketSizeHalf+1;
  const Index n_quarter = rows-1*ResPacketSizeQuarter+1;

  // TODO: improve the following heuristic:
  const Index block_cols = cols<128 ? cols : (lhsStride*sizeof(LhsScalar)<32000?16:4);
  ResPacket palpha = pset1<ResPacket>(alpha);
  ResPacketHalf palpha_half = pset1<ResPacketHalf>(alpha);
  ResPacketQuarter palpha_quarter = pset1<ResPacketQuarter>(alpha);

  for(Index j2=0; j2<cols; j2+=block_cols)
  {
    Index jend = numext::mini(j2+block_cols,cols);
    Index i=0;
    for(; i<n8; i+=ResPacketSize*8)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0)),
                c3 = pset1<ResPacket>(ResScalar(0)),
                c4 = pset1<ResPacket>(ResScalar(0)),
                c5 = pset1<ResPacket>(ResScalar(0)),
                c6 = pset1<ResPacket>(ResScalar(0)),
                c7 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
        c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*3,j),b0,c3);
        c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*4,j),b0,c4);
        c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*5,j),b0,c5);
        c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*6,j),b0,c6);
        c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*7,j),b0,c7);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));
      pstoreu(res+i+ResPacketSize*3, pmadd(c3,palpha,ploadu<ResPacket>(res+i+ResPacketSize*3)));
      pstoreu(res+i+ResPacketSize*4, pmadd(c4,palpha,ploadu<ResPacket>(res+i+ResPacketSize*4)));
      pstoreu(res+i+ResPacketSize*5, pmadd(c5,palpha,ploadu<ResPacket>(res+i+ResPacketSize*5)));
      pstoreu(res+i+ResPacketSize*6, pmadd(c6,palpha,ploadu<ResPacket>(res+i+ResPacketSize*6)));
      pstoreu(res+i+ResPacketSize*7, pmadd(c7,palpha,ploadu<ResPacket>(res+i+ResPacketSize*7)));
    }
    if(i<n4)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0)),
                c3 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
        c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*3,j),b0,c3);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));
      pstoreu(res+i+ResPacketSize*3, pmadd(c3,palpha,ploadu<ResPacket>(res+i+ResPacketSize*3)));

      i+=ResPacketSize*4;
    }
    if(i<n3)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));

      i+=ResPacketSize*3;
    }
    if(i<n2)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      i+=ResPacketSize*2;
    }
    if(i<n1)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      i+=ResPacketSize;
    }
    if(HasHalf && i<n_half)
    {
      ResPacketHalf c0 = pset1<ResPacketHalf>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacketHalf b0 = pset1<RhsPacketHalf>(rhs(j,0));
        c0 = pcj_half.pmadd(lhs.template load<LhsPacketHalf,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSizeHalf*0, pmadd(c0,palpha_half,ploadu<ResPacketHalf>(res+i+ResPacketSizeHalf*0)));
      i+=ResPacketSizeHalf;
    }
    if(HasQuarter && i<n_quarter)
    {
      ResPacketQuarter c0 = pset1<ResPacketQuarter>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacketQuarter b0 = pset1<RhsPacketQuarter>(rhs(j,0));
        c0 = pcj_quarter.pmadd(lhs.template load<LhsPacketQuarter,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSizeQuarter*0, pmadd(c0,palpha_quarter,ploadu<ResPacketQuarter>(res+i+ResPacketSizeQuarter*0)));
      i+=ResPacketSizeQuarter;
    }
    for(;i<rows;++i)
    {
      ResScalar c0(0);
      for(Index j=j2; j<jend; j+=1)
        c0 += cj.pmul(lhs(i,j), rhs(j,0));
      res[i] += alpha*c0;
    }
  }
}